

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O3

int dlep_reader_map_l2net_data(oonf_layer2_data *data,dlep_session *session,dlep_extension *ext)

{
  oonf_layer2_network_index idx;
  dlep_network_mapping *pdVar1;
  code *pcVar2;
  int iVar3;
  oonf_layer2_metadata *poVar4;
  ulong uVar5;
  long lVar6;
  
  if (ext->if_mapping_count != 0) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      pdVar1 = ext->if_mapping;
      pcVar2 = *(code **)((long)&pdVar1->from_tlv + lVar6);
      idx = *(oonf_layer2_network_index *)((long)&pdVar1->layer2 + lVar6);
      poVar4 = oonf_layer2_net_metadata_get(idx);
      iVar3 = (*pcVar2)(data + idx,poVar4,session,*(undefined2 *)((long)&pdVar1->dlep + lVar6),
                        *(undefined8 *)((long)&pdVar1->scaling + lVar6));
      if (iVar3 != 0) {
        return ~(uint)uVar5;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x40;
    } while (uVar5 < ext->if_mapping_count);
  }
  return 0;
}

Assistant:

int
dlep_reader_map_l2net_data(struct oonf_layer2_data *data, struct dlep_session *session, struct dlep_extension *ext) {
  struct dlep_network_mapping *map;
  size_t i;

  for (i = 0; i < ext->if_mapping_count; i++) {
    map = &ext->if_mapping[i];

    if (map->from_tlv(&data[map->layer2], oonf_layer2_net_metadata_get(map->layer2), session,
        map->dlep, map->scaling)) {
      return -(i + 1);
    }
  }
  return 0;
}